

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O2

void __thiscall QPDFArgParser::checkCompletion(QPDFArgParser *this)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  byte *pbVar4;
  element_type *peVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  allocator<char> local_71;
  string local_70;
  string bash_point_env;
  
  bash_point_env._M_dataplus._M_p = (pointer)&bash_point_env.field_2;
  bash_point_env._M_string_length = 0;
  bash_point_env.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"COMP_LINE",&local_71);
  bVar1 = QUtil::get_env(&local_70,
                         &((this->m).
                           super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->bash_line);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"COMP_POINT",&local_71);
  bVar2 = QUtil::get_env(&local_70,&bash_point_env);
  std::__cxx11::string::~string((string *)&local_70);
  if (bVar1 || bVar2) {
    uVar3 = QUtil::string_to_uint(bash_point_env._M_dataplus._M_p);
    uVar7 = (ulong)uVar3;
    peVar5 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    uVar8 = (peVar5->bash_line)._M_string_length;
    if (uVar7 < uVar8) {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&peVar5->bash_line);
      std::__cxx11::string::operator=
                ((string *)
                 &((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->bash_line,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      uVar8 = (((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->bash_line)._M_string_length;
    }
    if (uVar8 < uVar7) {
      uVar7 = uVar8;
    }
    do {
      if (uVar7 == 0) {
        uVar7 = 0;
        bVar6 = 0;
        break;
      }
      uVar7 = uVar7 - 1;
      pbVar4 = (byte *)std::__cxx11::string::at
                                 ((ulong)&((this->m).
                                           super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->bash_line);
      bVar6 = *pbVar4;
    } while ((0x3d < (ulong)bVar6) || ((0x2400000100000000U >> ((ulong)bVar6 & 0x3f) & 1) == 0));
    peVar5 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (uVar7 < (peVar5->bash_line)._M_string_length) {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&peVar5->bash_line);
      std::__cxx11::string::operator=
                ((string *)
                 &((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->bash_cur,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    if ((bVar6 == 0x3a) || (bVar6 == 0x3d)) {
      std::__cxx11::string::substr
                ((ulong)&local_70,
                 (ulong)&((this->m).
                          super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->bash_line);
    }
    else {
      uVar8 = 0;
      do {
        if (uVar8 == uVar7) goto LAB_0014fef9;
        pbVar4 = (byte *)std::__cxx11::string::at
                                   ((ulong)&((this->m).
                                             super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->bash_line);
        uVar8 = uVar8 + 1;
      } while ((0x3d < (ulong)*pbVar4) ||
              ((0x2400000100000000U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0));
      std::__cxx11::string::substr
                ((ulong)&local_70,
                 (ulong)&((this->m).
                          super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->bash_line);
    }
    std::__cxx11::string::operator=
              ((string *)
               &((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->bash_prev,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
LAB_0014fef9:
    peVar5 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if ((peVar5->bash_prev)._M_string_length == 0) {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&peVar5->bash_line);
      std::__cxx11::string::operator=
                ((string *)
                 &((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->bash_prev,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      peVar5 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    }
    if (peVar5->argc == 1) {
      peVar5->zsh_completion = true;
    }
    handleBashArguments(this);
    ((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    bash_completion = true;
  }
  std::__cxx11::string::~string((string *)&bash_point_env);
  return;
}

Assistant:

void
QPDFArgParser::checkCompletion()
{
    // See if we're being invoked from bash completion.
    std::string bash_point_env;
    // On Windows with mingw, there have been times when there appears to be no way to distinguish
    // between an empty environment variable and an unset variable. There are also conditions under
    // which bash doesn't set COMP_LINE. Therefore, enter this logic if either COMP_LINE or
    // COMP_POINT are set. They will both be set together under ordinary circumstances.
    bool got_line = QUtil::get_env("COMP_LINE", &m->bash_line);
    bool got_point = QUtil::get_env("COMP_POINT", &bash_point_env);
    if (got_line || got_point) {
        size_t p = QUtil::string_to_uint(bash_point_env.c_str());
        if (p < m->bash_line.length()) {
            // Truncate the line. We ignore everything at or after the
            // cursor for completion purposes.
            m->bash_line = m->bash_line.substr(0, p);
        }
        if (p > m->bash_line.length()) {
            p = m->bash_line.length();
        }
        // Set bash_cur and bash_prev based on bash_line rather than relying on argv. This enables
        // us to use bashcompinit to get completion in zsh too since bashcompinit sets COMP_LINE and
        // COMP_POINT but doesn't invoke the command with options like bash does.

        // p is equal to length of the string. Walk backwards looking for the first separator.
        // bash_cur is everything after the last separator, possibly empty.
        char sep(0);
        while (p > 0) {
            --p;
            char ch = m->bash_line.at(p);
            if ((ch == ' ') || (ch == '=') || (ch == ':')) {
                sep = ch;
                break;
            }
        }
        if (1 + p <= m->bash_line.length()) {
            m->bash_cur = m->bash_line.substr(1 + p, std::string::npos);
        }
        if ((sep == ':') || (sep == '=')) {
            // Bash sets prev to the non-space separator if any. Actually, if there are multiple
            // separators in a row, they are all included in prev, but that detail is not important
            // to us and not worth coding.
            m->bash_prev = m->bash_line.substr(p, 1);
        } else {
            // Go back to the last separator and set prev based on
            // that.
            size_t p1 = p;
            while (p1 > 0) {
                --p1;
                char ch = m->bash_line.at(p1);
                if ((ch == ' ') || (ch == ':') || (ch == '=')) {
                    m->bash_prev = m->bash_line.substr(p1 + 1, p - p1 - 1);
                    break;
                }
            }
        }
        if (m->bash_prev.empty()) {
            m->bash_prev = m->bash_line.substr(0, p);
        }
        if (m->argc == 1) {
            // This is probably zsh using bashcompinit. There are a few differences in the expected
            // output.
            m->zsh_completion = true;
        }
        handleBashArguments();
        m->bash_completion = true;
    }
}